

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_measurement.cpp
# Opt level: O3

void __thiscall fixedMeasurement_opsV2_Test::TestBody(fixedMeasurement_opsV2_Test *this)

{
  unit_data *this_00;
  unit_data *this_01;
  unit uVar1;
  bool bVar2;
  internal iVar3;
  unit_data uVar4;
  char *pcVar5;
  char *in_R9;
  pointer *__ptr;
  ulong uVar6;
  pointer *__ptr_1;
  double dVar7;
  float fVar8;
  fixed_measurement spd;
  AssertionResult gtest_ar;
  measurement m3;
  fixed_measurement d2;
  fixed_measurement d1;
  unit local_c0;
  undefined8 local_b8;
  undefined1 local_b0 [8];
  unit local_a8;
  undefined1 local_a0 [4];
  unit_data uStack_9c;
  unit local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  undefined1 local_80 [8];
  unit local_78;
  unit local_70;
  measurement local_68;
  AssertHelper local_58;
  fixed_measurement local_50;
  unit local_40;
  unit local_38;
  unit local_30;
  
  this_00 = &local_38.base_units_;
  local_40 = (unit)&DAT_4046800000000000;
  local_38 = (unit)&DAT_13f800000;
  local_50.value_ = (double)&DAT_4053c00000000000;
  local_50.units_ = (unit)&DAT_13f800000;
  _local_a0 = (unit)&DAT_13f800000;
  uVar4 = units::detail::unit_data::operator*(this_00,(unit_data *)(local_a0 + 4));
  local_c0 = (unit)&DAT_40abc60000000000;
  local_80 = (undefined1  [8])&DAT_40abc60000000000;
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)local_a0,"area.value()","45.0 * 79",(double *)&local_c0,(double *)local_80)
  ;
  if (local_a0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_c0);
    if (local_98 == (unit)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_98;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0xff,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_80,(Message *)&local_c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_80);
    if (local_c0 != (unit)0x0) {
      (**(code **)(*(long *)local_c0 + 8))();
    }
  }
  if (local_98 != (unit)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_98,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98);
  }
  _local_a0 = (unit)((ulong)(uint)uVar4 << 0x20 | 0x3f800000);
  uVar4 = units::detail::unit_data::operator*
                    ((unit_data *)((long)&units::m + 4),(unit_data *)((long)&units::m + 4));
  local_80 = (undefined1  [8])((ulong)(uint)uVar4 << 0x20 | 0x3f800000);
  bVar2 = units::unit::operator==((unit *)local_a0,(unit *)local_80);
  local_b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_c0.multiplier_._0_1_ = bVar2;
  if (!bVar2) {
    testing::Message::Message((Message *)local_80);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_a0,(internal *)&local_c0,(AssertionResult *)"area.units() == m * m",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x100,(char *)_local_a0);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_b0,(Message *)local_80);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_b0);
    if (_local_a0 != (unit)&local_90) {
      operator_delete((void *)_local_a0,local_90._M_allocated_capacity + 1);
    }
    if ((unit)local_80 != (unit)0x0) {
      (**(code **)(*(long *)local_80 + 8))();
    }
    if (local_b8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_b8,local_b8);
    }
  }
  this_01 = &local_50.units_.base_units_;
  local_70 = (unit)(local_50.value_ * (double)local_40);
  _local_a0 = local_50.units_;
  local_30.multiplier_ = local_50.units_.multiplier_ * local_38.multiplier_;
  uVar4 = units::detail::unit_data::operator*(this_00,(unit_data *)(local_a0 + 4));
  _local_a0 = local_70;
  local_98.base_units_ = uVar4;
  local_98.multiplier_ = local_30.multiplier_;
  local_70 = (unit)((double)local_40 * local_50.value_);
  local_80._0_4_ = local_38.multiplier_;
  local_80._4_4_ = local_38.base_units_;
  local_30.multiplier_ = local_38.multiplier_ * local_50.units_.multiplier_;
  uVar4 = units::detail::unit_data::operator*(this_01,(unit_data *)(local_80 + 4));
  local_80._0_4_ = local_70.multiplier_;
  local_80._4_4_ = local_70.base_units_;
  local_78.base_units_ = uVar4;
  local_78.multiplier_ = local_30.multiplier_;
  local_c0.multiplier_._0_1_ =
       units::measurement::operator==((measurement *)local_a0,(measurement *)local_80);
  local_b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_c0.multiplier_._0_1_) {
    testing::Message::Message((Message *)local_80);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_a0,(internal *)&local_c0,(AssertionResult *)"d1 * d2 == d2 * d1",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x102,(char *)_local_a0);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_b0,(Message *)local_80);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_b0);
    if (_local_a0 != (unit)&local_90) {
      operator_delete((void *)_local_a0,local_90._M_allocated_capacity + 1);
    }
    if ((unit)local_80 != (unit)0x0) {
      (**(code **)(*(long *)local_80 + 8))();
    }
    if (local_b8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_b8,local_b8);
    }
  }
  _local_a0 = (unit)local_50.value_;
  local_98 = local_50.units_;
  local_70 = local_40;
  dVar7 = units::measurement::value_as((measurement *)local_a0,&local_38);
  uVar1 = local_38;
  local_c0 = (unit)(dVar7 + (double)local_70);
  local_80 = (undefined1  [8])&DAT_405f000000000000;
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)local_a0,"sum.value()","45.0 + 79.0",(double *)&local_c0,(double *)local_80
            );
  if (local_a0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_c0);
    if (local_98 == (unit)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_98;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x105,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_80,(Message *)&local_c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_80);
    if (local_c0 != (unit)0x0) {
      (**(code **)(*(long *)local_c0 + 8))();
    }
  }
  if (local_98 != (unit)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_98,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98);
  }
  _local_a0 = uVar1;
  bVar2 = units::unit::operator==((unit *)local_a0,(unit *)&units::m);
  local_b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_c0.multiplier_._0_1_ = bVar2;
  if (!bVar2) {
    testing::Message::Message((Message *)local_80);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_a0,(internal *)&local_c0,(AssertionResult *)"sum.units() == m",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x106,(char *)_local_a0);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_b0,(Message *)local_80);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_b0);
    if (_local_a0 != (unit)&local_90) {
      operator_delete((void *)_local_a0,local_90._M_allocated_capacity + 1);
    }
    if ((unit)local_80 != (unit)0x0) {
      (**(code **)(*(long *)local_80 + 8))();
    }
    if (local_b8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_b8,local_b8);
    }
  }
  local_80 = (undefined1  [8])local_50.value_;
  local_78 = local_50.units_;
  local_70 = local_40;
  dVar7 = units::measurement::value_as((measurement *)local_80,&local_38);
  _local_a0 = (unit)(dVar7 + (double)local_70);
  local_98 = local_38;
  local_68.value_ = (double)local_40;
  local_68.units_ = local_38;
  local_70 = (unit)local_50.value_;
  dVar7 = units::measurement::value_as(&local_68,&local_50.units_);
  local_b0 = (undefined1  [8])(dVar7 + (double)local_70);
  local_a8 = local_50.units_;
  local_c0.multiplier_._0_1_ =
       units::fixed_measurement::operator==
                 ((fixed_measurement *)local_a0,(fixed_measurement *)local_b0);
  local_b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_c0.multiplier_._0_1_) {
    testing::Message::Message((Message *)local_80);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_a0,(internal *)&local_c0,(AssertionResult *)"d1 + d2 == d2 + d1",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x107,(char *)_local_a0);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_b0,(Message *)local_80);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_b0);
    if (_local_a0 != (unit)&local_90) {
      operator_delete((void *)_local_a0,local_90._M_allocated_capacity + 1);
    }
    if ((unit)local_80 != (unit)0x0) {
      (**(code **)(*(size_type *)local_80 + 8))();
    }
    if (local_b8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_b8,local_b8);
    }
  }
  _local_a0 = local_40;
  local_98 = local_38;
  local_70 = (unit)local_50.value_;
  dVar7 = units::measurement::value_as((measurement *)local_a0,&local_50.units_);
  uVar1 = local_50.units_;
  local_c0 = (unit)((double)local_70 - dVar7);
  local_80 = (undefined1  [8])&DAT_4041000000000000;
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)local_a0,"diff.value()","79.0 - 45",(double *)&local_c0,(double *)local_80)
  ;
  if (local_a0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_c0);
    if (local_98 == (unit)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_98;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x10a,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_80,(Message *)&local_c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_80);
    if (local_c0 != (unit)0x0) {
      (**(code **)(*(long *)local_c0 + 8))();
    }
  }
  if (local_98 != (unit)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_98,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98);
  }
  _local_a0 = uVar1;
  bVar2 = units::unit::operator==((unit *)local_a0,(unit *)&units::m);
  local_c0.multiplier_._0_1_ = bVar2;
  local_b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!bVar2) {
    testing::Message::Message((Message *)local_80);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_a0,(internal *)&local_c0,(AssertionResult *)"diff.units() == m",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x10b,(char *)_local_a0);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_b0,(Message *)local_80);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_b0);
    if (_local_a0 != (unit)&local_90) {
      operator_delete((void *)_local_a0,local_90._M_allocated_capacity + 1);
    }
    if ((unit)local_80 != (unit)0x0) {
      (**(code **)(*(long *)local_80 + 8))();
    }
    if (local_b8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_b8,local_b8);
    }
  }
  uVar1 = local_50.units_;
  local_30 = (unit)((double)local_40 / local_50.value_);
  _local_a0 = local_50.units_;
  local_70.multiplier_ = local_38.multiplier_;
  uVar4 = units::detail::unit_data::operator/(this_00,(unit_data *)(local_a0 + 4));
  local_c0 = local_30;
  local_80 = (undefined1  [8])&DAT_3fe23a5440cf6475;
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)local_a0,"rat.value()","45.0 / 79",(double *)&local_c0,(double *)local_80);
  if (local_a0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_c0);
    if (local_98 == (unit)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_98;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x10e,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_80,(Message *)&local_c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_80);
    if (local_c0 != (unit)0x0) {
      (**(code **)(*(long *)local_c0 + 8))();
    }
  }
  fVar8 = local_70.multiplier_ / uVar1.multiplier_;
  if (local_98 != (unit)0x0) {
    local_70.multiplier_ = fVar8;
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_98,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98);
    fVar8 = local_70.multiplier_;
  }
  uStack_9c = uVar4;
  local_a0 = (undefined1  [4])fVar8;
  bVar2 = units::unit::operator==((unit *)local_a0,(unit *)&units::ratio);
  local_c0.multiplier_._0_1_ = bVar2;
  local_b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!bVar2) {
    testing::Message::Message((Message *)local_80);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_a0,(internal *)&local_c0,(AssertionResult *)"rat.units() == ratio",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x10f,(char *)_local_a0);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_b0,(Message *)local_80);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_b0);
    if (_local_a0 != (unit)&local_90) {
      operator_delete((void *)_local_a0,local_90._M_allocated_capacity + 1);
    }
    if ((unit)local_80 != (unit)0x0) {
      (**(code **)(*(long *)local_80 + 8))();
    }
    if (local_b8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_b8,local_b8);
    }
  }
  local_70 = (unit)local_50.value_;
  uVar6 = (ulong)local_50.units_ & 0xffffffff;
  uVar4 = units::detail::unit_data::operator/(this_01,(unit_data *)((long)&units::s + 4));
  local_b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((ulong)(uint)uVar4 << 0x20 | uVar6);
  local_c0 = local_70;
  uVar4 = units::detail::unit_data::operator*
                    ((unit_data *)((long)&local_b8 + 4),(unit_data *)((long)&units::s + 4));
  local_78 = (unit)((ulong)(uint)uVar4 << 0x20 | uVar6);
  local_80._0_4_ = local_70.multiplier_;
  local_80._4_4_ = local_70.base_units_;
  iVar3 = (internal)units::fixed_measurement::operator==(&local_50,(measurement *)local_80);
  local_a8.multiplier_ = 0.0;
  local_a8.base_units_ = (unit_data)0x0;
  local_b0[0] = iVar3;
  if (!(bool)iVar3) {
    testing::Message::Message((Message *)&local_68);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_a0,(internal *)local_b0,(AssertionResult *)"d2 == m3","false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x115,(char *)_local_a0);
    testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    if (_local_a0 != (unit)&local_90) {
      operator_delete((void *)_local_a0,local_90._M_allocated_capacity + 1);
    }
    if ((unit)local_68.value_ != (unit)0x0) {
      (**(code **)(*(long *)local_68.value_ + 8))();
    }
    if (local_a8 != (unit)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_b0 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8);
    }
  }
  _local_a0 = (unit)local_50.value_;
  local_98 = local_50.units_;
  local_b0[0] = (internal)
                units::measurement::operator==((measurement *)local_80,(measurement *)local_a0);
  local_a8.multiplier_ = 0.0;
  local_a8.base_units_ = (unit_data)0x0;
  if (!(bool)local_b0[0]) {
    testing::Message::Message((Message *)&local_68);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_a0,(internal *)local_b0,(AssertionResult *)"m3 == d2","false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x116,(char *)_local_a0);
    testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    if (_local_a0 != (unit)&local_90) {
      operator_delete((void *)_local_a0,local_90._M_allocated_capacity + 1);
    }
    if ((unit)local_68.value_ != (unit)0x0) {
      (**(code **)(*(long *)local_68.value_ + 8))();
    }
    if (local_a8 != (unit)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_b0 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8);
    }
  }
  local_b0 = (undefined1  [8])&DAT_4010000000000000;
  local_68.value_ = (double)&DAT_4010000000000000;
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)local_a0,"fm3.value()","4.0",(double *)local_b0,&local_68.value_);
  if (local_a0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_b0);
    if (local_98 == (unit)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_98;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x11a,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_68,(Message *)local_b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_68);
    if (local_b0 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_b0 + 8))();
    }
  }
  if (local_98 != (unit)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_98,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98);
  }
  local_b0 = (undefined1  [8])&DAT_3ff0000000000000;
  local_68.value_ = 1.0;
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)local_a0,"fm3.value()","1.0",(double *)local_b0,&local_68.value_);
  if (local_a0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_b0);
    if (local_98 == (unit)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_98;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x11c,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_68,(Message *)local_b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_68);
    if (local_b0 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_b0 + 8))();
    }
  }
  if (local_98 != (unit)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_98,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98);
  }
  local_b0 = (undefined1  [8])&DAT_4000000000000000;
  local_68.value_ = 2.0;
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)local_a0,"v.value()","2.0",(double *)local_b0,&local_68.value_);
  if (local_a0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_b0);
    if (local_98 == (unit)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_98;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x11f,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_68,(Message *)local_b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_68);
    if (local_b0 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_b0 + 8))();
    }
  }
  if (local_98 != (unit)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_98,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98);
  }
  return;
}

Assistant:

TEST(fixedMeasurement, opsV2)
{
    fixed_measurement d1(45.0, m);
    fixed_measurement d2(79, m);

    auto area = d1 * d2;
    EXPECT_EQ(area.value(), 45.0 * 79);
    EXPECT_TRUE(area.units() == m * m);

    EXPECT_TRUE(d1 * d2 == d2 * d1);

    auto sum = d1 + d2;
    EXPECT_EQ(sum.value(), 45.0 + 79.0);
    EXPECT_TRUE(sum.units() == m);
    EXPECT_TRUE(d1 + d2 == d2 + d1);

    auto diff = d2 - d1;
    EXPECT_EQ(diff.value(), 79.0 - 45);
    EXPECT_TRUE(diff.units() == m);

    auto rat = d1 / d2;
    EXPECT_EQ(rat.value(), 45.0 / 79);
    EXPECT_TRUE(rat.units() == ratio);

    auto m1 = d2 / s;
    fixed_measurement spd(m1);
    auto m3 = spd * s;

    EXPECT_TRUE(d2 == m3);
    EXPECT_TRUE(m3 == d2);

    fixed_measurement fm3(2.0, m);
    fm3 *= 2.0;
    EXPECT_EQ(fm3.value(), 4.0);
    fm3 /= 4.0;
    EXPECT_EQ(fm3.value(), 1.0);

    auto v = fm3 *= 2.0;
    EXPECT_EQ(v.value(), 2.0);
}